

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_help(Formatter *this,App *app,string *name,AppFormatMode mode)

{
  bool bVar1;
  ulong uVar2;
  App *pAVar3;
  string *psVar4;
  ostream *poVar5;
  string *in_RCX;
  App *in_RDX;
  long *in_RSI;
  string *in_RDI;
  int in_R8D;
  bool in_stack_00000077;
  string *in_stack_00000078;
  size_t in_stack_00000080;
  string *in_stack_00000088;
  ostream *in_stack_00000090;
  stringstream out;
  char *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  allocator *paVar6;
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  string local_1e0 [48];
  stringstream local_1b0 [16];
  ostream local_1a0 [236];
  AppFormatMode in_stack_ffffffffffffff4c;
  App *in_stack_ffffffffffffff50;
  Formatter *in_stack_ffffffffffffff58;
  
  if (in_R8D == 2) {
    (**(code **)(*in_RSI + 0x38))(in_RDI,in_RSI,in_RDX,2);
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b0);
    App::get_name_abi_cxx11_(in_RDX);
    uVar2 = ::std::__cxx11::string::empty();
    if (((uVar2 & 1) != 0) && (pAVar3 = App::get_parent(in_RDX), pAVar3 != (App *)0x0)) {
      App::get_group_abi_cxx11_(in_RDX);
      bVar1 = ::std::operator!=(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      if (bVar1) {
        psVar4 = App::get_group_abi_cxx11_(in_RDX);
        poVar5 = ::std::operator<<(local_1a0,(string *)psVar4);
        ::std::operator<<(poVar5,':');
      }
    }
    (**(code **)(*in_RSI + 0x48))(local_1e0,in_RSI,in_RDX);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_200,"",&local_201);
    detail::streamOutAsParagraph
              (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
               in_stack_00000077);
    ::std::__cxx11::string::~string(local_200);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
    ::std::__cxx11::string::~string(local_1e0);
    ::std::__cxx11::string::string(local_248,in_RCX);
    (**(code **)(*in_RSI + 0x50))(local_228,in_RSI,in_RDX,local_248);
    ::std::operator<<(local_1a0,local_228);
    ::std::__cxx11::string::~string(local_228);
    ::std::__cxx11::string::~string(local_248);
    make_groups_abi_cxx11_
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    ::std::operator<<(local_1a0,local_268);
    ::std::__cxx11::string::~string(local_268);
    (**(code **)(*in_RSI + 0x28))(local_288,in_RSI,in_RDX,in_R8D);
    ::std::operator<<(local_1a0,local_288);
    ::std::__cxx11::string::~string(local_288);
    (**(code **)(*in_RSI + 0x40))(local_2a8,in_RSI,in_RDX);
    paVar6 = &local_2c9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_2c8,"",paVar6);
    detail::streamOutAsParagraph
              (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
               in_stack_00000077);
    ::std::__cxx11::string::~string(local_2c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    ::std::__cxx11::string::~string(local_2a8);
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_help(const App *app, std::string name, AppFormatMode mode) const {
    // This immediately forwards to the make_expanded method. This is done this way so that subcommands can
    // have overridden formatters
    if(mode == AppFormatMode::Sub)
        return make_expanded(app, mode);

    std::stringstream out;
    if((app->get_name().empty()) && (app->get_parent() != nullptr)) {
        if(app->get_group() != "SUBCOMMANDS") {
            out << app->get_group() << ':';
        }
    }

    detail::streamOutAsParagraph(
        out, make_description(app), description_paragraph_width_, "");  // Format description as paragraph
    out << make_usage(app, name);
    // out << make_positionals(app);
    out << make_groups(app, mode);
    out << make_subcommands(app, mode);
    detail::streamOutAsParagraph(out, make_footer(app), footer_paragraph_width_);  // Format footer as paragraph

    return out.str();
}